

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::HBDMinMaxTest_MinValue_Test::~HBDMinMaxTest_MinValue_Test
          (HBDMinMaxTest_MinValue_Test *this)

{
  HBDMinMaxTest_MinValue_Test *in_stack_00000010;
  
  anon_unknown.dwarf_13161f6::HBDMinMaxTest_MinValue_Test::~HBDMinMaxTest_MinValue_Test
            (in_stack_00000010);
  return;
}

Assistant:

TEST_P(HBDMinMaxTest, MinValue) {
  uint8_t *a = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  uint8_t *b = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  for (int i = 0; i < 64; i++) {
    aom_memset16(CONVERT_TO_SHORTPTR(a), 0, 64);
    aom_memset16(CONVERT_TO_SHORTPTR(b), 65535, 64);
    CONVERT_TO_SHORTPTR(b)[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(65535, max);
    EXPECT_EQ(i, min);
  }
  aom_free(CONVERT_TO_SHORTPTR(a));
  aom_free(CONVERT_TO_SHORTPTR(b));
}